

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O0

mFILE * mfcreate_from(char *path,char *mode_str,FILE *fp)

{
  mFILE *mf;
  FILE *fp_local;
  char *mode_str_local;
  char *path_local;
  
  path_local = (char *)mfreopen(path,mode_str,fp);
  if ((mFILE *)path_local == (mFILE *)0x0) {
    path_local = (char *)0x0;
  }
  else {
    ((mFILE *)path_local)->fp = (FILE *)0x0;
  }
  return (mFILE *)path_local;
}

Assistant:

mFILE *mfcreate_from(const char *path, const char *mode_str, FILE *fp) {
   mFILE *mf; 

    /* Open using mfreopen() */
    if (NULL == (mf = mfreopen(path, mode_str, fp)))
	return NULL;
    
    /* Disassociate from the input stream */
    mf->fp = NULL;

    return mf;
}